

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

int INT_EVtake_event_buffer(CManager_conflict cm,void *event)

{
  long lVar1;
  void *in_RSI;
  long in_RDI;
  event_path_data evp;
  queue_item *running_events;
  event_item *cur;
  queue_item *item;
  long *size;
  event_item *local_28;
  undefined8 *local_20;
  int local_4;
  
  size = *(long **)(*(long *)(in_RDI + 0x118) + 0x60);
  lVar1 = *(long *)(in_RDI + 0x118);
  while (((local_28 = (event_item *)0x0, size != (long *)0x0 &&
          ((local_28 = (event_item *)*size, in_RSI < local_28->decoded_event ||
           ((void *)((long)local_28->decoded_event + local_28->event_len) < in_RSI)))) &&
         ((in_RSI < local_28->encoded_event ||
          ((void *)((long)local_28->encoded_event + local_28->event_len) < in_RSI))))) {
    size = (long *)size[2];
  }
  if (local_28 == (event_item *)0x0) {
    fprintf(_stderr,
            "Event address (%p) in INT_EVtake_event_buffer does not match currently executing event on this CM.\n"
            ,in_RSI);
    local_4 = 0;
  }
  else {
    if (*(long *)(lVar1 + 0x58) == 0) {
      local_20 = (undefined8 *)INT_CMmalloc((size_t)size);
    }
    else {
      local_20 = *(undefined8 **)(lVar1 + 0x58);
      *(undefined8 *)(lVar1 + 0x58) = local_20[2];
    }
    *local_20 = local_28;
    reference_event(local_28);
    local_20[2] = *(undefined8 *)(lVar1 + 0x68);
    *(undefined8 **)(lVar1 + 0x68) = local_20;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

extern int
INT_EVtake_event_buffer(CManager cm, void *event)
{
    queue_item *item;
    event_item *cur = NULL;
    queue_item *running_events = cm->evp->current_event_list;
    event_path_data evp = cm->evp;

    while(running_events != NULL) {
	cur = running_events->item;
	if (!(((cur->decoded_event <= event) &&
	       ((char *) event <= ((char *) cur->decoded_event + cur->event_len))) ||
	      ((cur->encoded_event <= event) &&
	       ((char *) event <= ((char *) cur->encoded_event + cur->event_len))))) {
	    cur = NULL;
	} else {
	    break;
	}
	running_events = running_events->next;
    }
    if (cur == NULL) {
	fprintf(stderr,
		"Event address (%p) in INT_EVtake_event_buffer does not match currently executing event on this CM.\n",
		event);
	return 0;
    }

/*    if (cur->block_rec == NULL) {
	static int take_event_warning = 0;
	if (take_event_warning == 0) {
	    fprintf(stderr,
		    "Warning:  INT_EVtake_event_buffer called on an event submitted with \n    INT_EVsubmit_event(), INT_EVsubmit_typed_event() or INT_EVsubmit_eventV() .\n    This violates ECho event data memory handling requirements.  See \n    http://www.cc.gatech.edu/systems/projects/ECho/event_memory.html\n");
	    take_event_warning++;
	}
	return 0;
    }
*/
    if (evp->queue_items_free_list == NULL) {
	item = malloc(sizeof(*item));
    } else {
	item = evp->queue_items_free_list;
	evp->queue_items_free_list = item->next;
    }
    item->item = cur;
    reference_event(cur);
    item->next = evp->taken_events_list;
    evp->taken_events_list = item;
    return 1;
}